

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  bool bVar1;
  cmMakefile *pcVar2;
  pointer ppVar3;
  char *pcVar4;
  reference pbVar5;
  ostream *poVar6;
  string local_688;
  string local_668;
  string local_648;
  allocator local_621;
  undefined1 local_620 [8];
  string stamp;
  undefined1 local_5f8 [8];
  string mod_lower;
  allocator local_5b1;
  undefined1 local_5b0 [8];
  string mod_upper;
  _Self local_588;
  const_iterator i_2;
  cmGeneratedFileStream fcStream;
  string fcName;
  _Self local_310;
  const_iterator i_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provides;
  cmGeneratedFileStream fiStream;
  string fiName;
  _Self local_90;
  const_iterator i;
  ObjectInfoMap *objInfo;
  allocator local_69;
  string local_68;
  cmMakefile *local_48;
  char *target_mod_dir;
  cmMakefile *mf;
  char *mod_dir;
  char *stamp_dir;
  ostream *internalDepends_local;
  ostream *makeDepends_local;
  cmDependsFortran *this_local;
  
  stamp_dir = (char *)internalDepends;
  internalDepends_local = makeDepends;
  makeDepends_local = (ostream *)this;
  LocateModules(this);
  mod_dir = (char *)std::__cxx11::string::c_str();
  pcVar2 = cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
  target_mod_dir = (char *)pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_Fortran_TARGET_MODULE_DIR",&local_69);
  pcVar2 = (cmMakefile *)cmMakefile::GetDefinition(pcVar2,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = pcVar2;
  mf = pcVar2;
  if (pcVar2 == (cmMakefile *)0x0) {
    pcVar2 = cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
    mf = (cmMakefile *)cmMakefile::GetCurrentBinaryDirectory(pcVar2);
  }
  i._M_node = (_Base_ptr)&this->Internal->ObjectInfo;
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
                *)i._M_node);
  do {
    fiName.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
                *)i._M_node);
    bVar1 = std::operator!=(&local_90,(_Self *)((long)&fiName.field_2 + 8));
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&fiStream.field_0x240,(string *)&(this->super_cmDepends).TargetDirectory)
      ;
      std::__cxx11::string::operator+=((string *)&fiStream.field_0x240,"/fortran.internal");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&provides,pcVar4,false);
      std::operator<<((ostream *)&provides,"# The fortran modules provided by this target.\n");
      std::operator<<((ostream *)&provides,"provides\n");
      i_1._M_node = (_Base_ptr)this->Internal;
      local_310._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i_1._M_node);
      while( true ) {
        fcName.field_2._8_8_ =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i_1._M_node);
        bVar1 = std::operator!=(&local_310,(_Self *)((long)&fcName.field_2 + 8));
        if (!bVar1) break;
        poVar6 = std::operator<<((ostream *)&provides," ");
        pbVar5 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_310);
        poVar6 = std::operator<<(poVar6,(string *)pbVar5);
        std::operator<<(poVar6,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_310);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)i_1._M_node);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)&fcStream.field_0x240,
                   (string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::operator+=
                  ((string *)&fcStream.field_0x240,"/cmake_clean_Fortran.cmake");
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&i_2,pcVar4,false);
        std::operator<<((ostream *)&i_2,"# Remove fortran modules provided by this target.\n");
        std::operator<<((ostream *)&i_2,"FILE(REMOVE");
        local_588._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(i_1._M_node);
        while( true ) {
          mod_upper.field_2._8_8_ =
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)i_1._M_node);
          bVar1 = std::operator!=(&local_588,(_Self *)((long)&mod_upper.field_2 + 8));
          pcVar2 = mf;
          if (!bVar1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_5b0,(char *)pcVar2,&local_5b1);
          std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
          std::__cxx11::string::operator+=((string *)local_5b0,"/");
          pbVar5 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_588);
          cmsys::SystemTools::UpperCase((string *)((long)&mod_lower.field_2 + 8),pbVar5);
          std::__cxx11::string::operator+=
                    ((string *)local_5b0,(string *)(mod_lower.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)local_5b0,".mod");
          pcVar2 = mf;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_5f8,(char *)pcVar2,
                     (allocator *)(stamp.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(stamp.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator+=((string *)local_5f8,"/");
          pbVar5 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_588);
          std::__cxx11::string::operator+=((string *)local_5f8,(string *)pbVar5);
          std::__cxx11::string::operator+=((string *)local_5f8,".mod");
          pcVar4 = mod_dir;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_620,pcVar4,&local_621);
          std::allocator<char>::~allocator((allocator<char> *)&local_621);
          std::__cxx11::string::operator+=((string *)local_620,"/");
          pbVar5 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_588);
          std::__cxx11::string::operator+=((string *)local_620,(string *)pbVar5);
          std::__cxx11::string::operator+=((string *)local_620,".mod.stamp");
          std::operator<<((ostream *)&i_2,"\n");
          poVar6 = std::operator<<((ostream *)&i_2,"  \"");
          cmOutputConverter::Convert
                    (&local_648,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                     (string *)local_5f8,START_OUTPUT,UNCHANGED);
          poVar6 = std::operator<<(poVar6,(string *)&local_648);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_648);
          poVar6 = std::operator<<((ostream *)&i_2,"  \"");
          cmOutputConverter::Convert
                    (&local_668,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                     (string *)local_5b0,START_OUTPUT,UNCHANGED);
          poVar6 = std::operator<<(poVar6,(string *)&local_668);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_668);
          poVar6 = std::operator<<((ostream *)&i_2,"  \"");
          cmOutputConverter::Convert
                    (&local_688,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                     (string *)local_620,START_OUTPUT,UNCHANGED);
          poVar6 = std::operator<<(poVar6,(string *)&local_688);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_688);
          std::__cxx11::string::~string((string *)local_620);
          std::__cxx11::string::~string((string *)local_5f8);
          std::__cxx11::string::~string((string *)local_5b0);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_588);
        }
        std::operator<<((ostream *)&i_2,"  )\n");
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&i_2);
        std::__cxx11::string::~string((string *)&fcStream.field_0x240);
      }
      this_local._7_1_ = 1;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&provides);
      std::__cxx11::string::~string((string *)&fiStream.field_0x240);
LAB_0075a18f:
      return (bool)(this_local._7_1_ & 1);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>
    ::operator->(&local_90);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>
             ::operator->(&local_90);
    bVar1 = WriteDependenciesReal
                      (this,pcVar4,&ppVar3->second,(char *)mf,mod_dir,internalDepends_local,
                       (ostream *)stamp_dir);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0075a18f;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>
    ::operator++(&local_90);
  } while( true );
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const char* stamp_dir = this->TargetDirectory.c_str();

  // Get the directory in which module files will be created.
  const char* mod_dir;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  if(const char* target_mod_dir =
     mf->GetDefinition("CMAKE_Fortran_TARGET_MODULE_DIR"))
    {
    mod_dir = target_mod_dir;
    }
  else
    {
    mod_dir =
      this->LocalGenerator->GetMakefile()->GetCurrentBinaryDirectory();
    }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for(ObjectInfoMap::const_iterator i = objInfo.begin();
      i != objInfo.end(); ++i)
    {
    if(!this->WriteDependenciesReal(i->first.c_str(), i->second,
                                    mod_dir, stamp_dir,
                                    makeDepends, internalDepends))
      {
      return false;
      }
    }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName.c_str());
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for(std::set<std::string>::const_iterator i = provides.begin();
      i != provides.end(); ++i)
    {
    fiStream << " " << *i << "\n";
    }

  // Create a script to clean the modules.
  if(!provides.empty())
    {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName.c_str());
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    for(std::set<std::string>::const_iterator i = provides.begin();
        i != provides.end(); ++i)
      {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      mod_upper += cmSystemTools::UpperCase(*i);
      mod_upper += ".mod";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      mod_lower += *i;
      mod_lower += ".mod";
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += *i;
      stamp += ".mod.stamp";
      fcStream << "\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(mod_lower,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(mod_upper,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      fcStream << "  \"" <<
        this->LocalGenerator->Convert(stamp,
                                      cmLocalGenerator::START_OUTPUT)
               << "\"\n";
      }
    fcStream << "  )\n";
    }
  return true;
}